

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O0

void av1_free_internal_frame_buffers(InternalFrameBufferList *list)

{
  int *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar1 * 0x18) = 0;
  }
  aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  return;
}

Assistant:

void av1_free_internal_frame_buffers(InternalFrameBufferList *list) {
  int i;

  assert(list != NULL);

  for (i = 0; i < list->num_internal_frame_buffers; ++i) {
    aom_free(list->int_fb[i].data);
    list->int_fb[i].data = NULL;
  }
  aom_free(list->int_fb);
  list->int_fb = NULL;
  list->num_internal_frame_buffers = 0;
}